

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O3

int __thiscall
spdlog::async_logger::clone
          (async_logger *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined1 local_29;
  _func_int **local_28;
  pointer pcStack_20;
  
  std::__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<spdlog::async_logger>,spdlog::async_logger&>
            ((__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (allocator<spdlog::async_logger> *)&local_29,(async_logger *)__fn);
  std::__cxx11::string::operator=((string *)(local_28 + 1),(string *)__child_stack);
  (this->super_logger)._vptr_logger = local_28;
  (this->super_logger).name_._M_dataplus._M_p = pcStack_20;
  return (int)this;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<spdlog::logger> spdlog::async_logger::clone(std::string new_name) {
    auto cloned = std::make_shared<spdlog::async_logger>(*this);
    cloned->name_ = std::move(new_name);
    return cloned;
}